

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall DBaseStatusBar::DrSmallNumber(DBaseStatusBar *this,int val,int x,int y)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FTexture *pFVar4;
  
  uVar3 = 999;
  if (val < 999) {
    uVar3 = val;
  }
  if (val < 100) {
    if (val < 10) goto LAB_004ce76f;
  }
  else {
    pFVar4 = FImageCollection::operator[](&this->Images,uVar3 / 100 + 0x17);
    DrawImage(this,pFVar4,x,y,(FRemapTable *)0x0);
    uVar3 = uVar3 % 100;
  }
  iVar2 = (int)uVar3 >> 0x1f;
  iVar1 = (int)uVar3 / 10 + iVar2;
  pFVar4 = FImageCollection::operator[](&this->Images,(iVar1 - iVar2) + 0x17);
  DrawImage(this,pFVar4,x + 4,y,(FRemapTable *)0x0);
  uVar3 = uVar3 + (iVar1 - iVar2) * -10;
LAB_004ce76f:
  pFVar4 = FImageCollection::operator[](&this->Images,uVar3 + 0x17);
  DrawImage(this,pFVar4,x + 8,y,(FRemapTable *)0x0);
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumber (int val, int x, int y) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		DrawImage (Images[imgSmNumbers + digit], x, y);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		DrawImage (Images[imgSmNumbers + digit], x+4, y);
		val -= digit * 10;
	}
	DrawImage (Images[imgSmNumbers + val], x+8, y);
}